

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double insphereadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double permanent)

{
  double b;
  double b_00;
  double b_01;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  double b_02;
  double b_03;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double b_04;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double b_05;
  double dVar40;
  double dVar41;
  double dVar42;
  double b_06;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double da [4];
  double ac [4];
  double ab [4];
  double temp8c [8];
  double temp8b [8];
  double temp8a [8];
  double bd [4];
  double cd [4];
  double bc [4];
  double temp16 [16];
  double temp24 [24];
  double xdet [96];
  double temp48 [48];
  double zdet [96];
  double ydet [96];
  double xydet [192];
  double cdet [288];
  double bdet [288];
  double adet [288];
  double ddet [288];
  double fin1 [1152];
  double cddet [576];
  double abdet [576];
  double local_8078;
  double local_8068;
  double local_7f78;
  double local_7f70;
  double local_7f68;
  double local_7f60;
  double local_7f58;
  double local_7f50;
  double local_7f48;
  double local_7f40;
  double local_7f38;
  double local_7f30;
  double local_7f28;
  double local_7f20;
  double local_7f18 [8];
  double local_7ed8 [8];
  double local_7e98 [8];
  double local_7e58;
  double local_7e50;
  double local_7e48;
  double local_7e40;
  double local_7e38;
  double local_7e30;
  double local_7e28;
  double local_7e20;
  double local_7e18;
  double local_7e10;
  double local_7e08;
  double local_7e00;
  double local_7df8 [16];
  double local_7d78 [24];
  double local_7cb8 [96];
  double local_79b8 [48];
  double local_7838 [96];
  double local_7538 [96];
  double local_7238 [192];
  double local_6c38 [288];
  double local_6338 [288];
  double local_5a38 [288];
  double local_5138 [288];
  double local_4838 [1152];
  double local_2438 [576];
  double local_1238 [577];
  
  dVar12 = *pa;
  dVar17 = *pe;
  dVar30 = pe[1];
  b_05 = dVar12 - dVar17;
  dVar21 = pb[1];
  b_02 = dVar21 - dVar30;
  dVar31 = b_05 * b_02;
  dVar18 = b_05 * splitter - (b_05 * splitter - b_05);
  dVar40 = b_05 - dVar18;
  dVar14 = b_02 * splitter - (b_02 * splitter - b_02);
  dVar19 = b_02 - dVar14;
  dVar23 = *pb;
  dVar27 = dVar40 * dVar19 - (((dVar31 - dVar18 * dVar14) - dVar40 * dVar14) - dVar18 * dVar19);
  b_03 = dVar23 - dVar17;
  dVar20 = b_03 * splitter - (b_03 * splitter - b_03);
  dVar26 = pa[1];
  b_04 = dVar26 - dVar30;
  dVar28 = b_04 * splitter - (b_04 * splitter - b_04);
  dVar34 = b_03 * b_04;
  dVar10 = b_03 - dVar20;
  dVar15 = b_04 - dVar28;
  dVar39 = pc[1];
  b = dVar39 - dVar30;
  dVar16 = b * splitter - (b * splitter - b);
  dVar45 = *pc;
  b_00 = dVar45 - dVar17;
  dVar35 = b_00 * splitter - (b_00 * splitter - b_00);
  dVar11 = pd[1];
  b_01 = dVar11 - dVar30;
  dVar46 = b_01 * splitter - (b_01 * splitter - b_01);
  dVar13 = *pd;
  b_06 = dVar13 - dVar17;
  dVar29 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar44 = b - dVar16;
  dVar43 = b_06 - dVar29;
  dVar36 = b_00 - dVar35;
  dVar25 = b_01 - dVar46;
  dVar33 = dVar10 * dVar15 - (((dVar34 - dVar20 * dVar28) - dVar10 * dVar28) - dVar20 * dVar15);
  dVar41 = dVar27 - dVar33;
  local_7f38 = (dVar27 - (dVar41 + (dVar27 - dVar41))) + ((dVar27 - dVar41) - dVar33);
  dVar33 = pa[2];
  dVar27 = pe[2];
  dVar22 = pb[2];
  dVar24 = pc[2];
  dVar37 = pd[2];
  dVar1 = dVar31 + dVar41;
  dVar41 = (dVar31 - (dVar1 - (dVar1 - dVar31))) + (dVar41 - (dVar1 - dVar31));
  dVar31 = dVar41 - dVar34;
  local_7f30 = (dVar41 - (dVar31 + (dVar41 - dVar31))) + ((dVar41 - dVar31) - dVar34);
  dVar32 = dVar1 + dVar31;
  local_7f28 = (dVar1 - (dVar32 - (dVar32 - dVar1))) + (dVar31 - (dVar32 - dVar1));
  dVar34 = b_03 * b;
  dVar41 = dVar10 * dVar44 - (((dVar34 - dVar20 * dVar16) - dVar10 * dVar16) - dVar20 * dVar44);
  dVar42 = b_00 * b_02;
  dVar1 = dVar36 * dVar19 - (((dVar42 - dVar35 * dVar14) - dVar36 * dVar14) - dVar35 * dVar19);
  dVar31 = dVar41 - dVar1;
  local_7e18 = (dVar41 - (dVar31 + (dVar41 - dVar31))) + ((dVar41 - dVar31) - dVar1);
  dVar1 = dVar34 + dVar31;
  dVar41 = (dVar34 - (dVar1 - (dVar1 - dVar34))) + (dVar31 - (dVar1 - dVar34));
  dVar31 = dVar41 - dVar42;
  local_7e10 = (dVar41 - (dVar31 + (dVar41 - dVar31))) + ((dVar41 - dVar31) - dVar42);
  dVar34 = dVar1 + dVar31;
  local_7e08 = (dVar1 - (dVar34 - (dVar34 - dVar1))) + (dVar31 - (dVar34 - dVar1));
  dVar1 = b_00 * b_01;
  dVar47 = dVar36 * dVar25 - (((dVar1 - dVar35 * dVar46) - dVar36 * dVar46) - dVar35 * dVar25);
  dVar42 = b_06 * b;
  dVar41 = dVar43 * dVar44 - (((dVar42 - dVar29 * dVar16) - dVar43 * dVar16) - dVar29 * dVar44);
  dVar31 = dVar47 - dVar41;
  local_7e38 = (dVar47 - (dVar31 + (dVar47 - dVar31))) + ((dVar47 - dVar31) - dVar41);
  dVar41 = dVar1 + dVar31;
  dVar1 = (dVar1 - (dVar41 - (dVar41 - dVar1))) + (dVar31 - (dVar41 - dVar1));
  dVar31 = dVar1 - dVar42;
  local_7e30 = (dVar1 - (dVar31 + (dVar1 - dVar31))) + ((dVar1 - dVar31) - dVar42);
  dVar38 = dVar41 + dVar31;
  local_7e28 = (dVar41 - (dVar38 - (dVar38 - dVar41))) + (dVar31 - (dVar38 - dVar41));
  dVar1 = b_06 * b_04;
  dVar31 = dVar43 * dVar15 - (((dVar1 - dVar29 * dVar28) - dVar43 * dVar28) - dVar29 * dVar15);
  dVar47 = b_05 * b_01;
  dVar42 = dVar40 * dVar25 - (((dVar47 - dVar18 * dVar46) - dVar40 * dVar46) - dVar18 * dVar25);
  dVar41 = dVar31 - dVar42;
  local_7f78 = (dVar31 - (dVar41 + (dVar31 - dVar41))) + ((dVar31 - dVar41) - dVar42);
  dVar31 = dVar1 + dVar41;
  dVar1 = (dVar1 - (dVar31 - (dVar31 - dVar1))) + (dVar41 - (dVar31 - dVar1));
  dVar41 = dVar1 - dVar47;
  local_7f70 = (dVar1 - (dVar41 + (dVar1 - dVar41))) + ((dVar1 - dVar41) - dVar47);
  dVar42 = dVar31 + dVar41;
  local_7f68 = (dVar31 - (dVar42 - (dVar42 - dVar31))) + (dVar41 - (dVar42 - dVar31));
  dVar1 = b_05 * b;
  dVar18 = dVar44 * dVar40 - (((dVar1 - dVar18 * dVar16) - dVar16 * dVar40) - dVar18 * dVar44);
  dVar16 = b_00 * b_04;
  dVar41 = dVar36 * dVar15 - (((dVar16 - dVar35 * dVar28) - dVar28 * dVar36) - dVar35 * dVar15);
  dVar31 = dVar18 - dVar41;
  local_7f58 = (dVar18 - (dVar31 + (dVar18 - dVar31))) + ((dVar18 - dVar31) - dVar41);
  dVar41 = dVar1 + dVar31;
  dVar1 = (dVar1 - (dVar41 - (dVar41 - dVar1))) + (dVar31 - (dVar41 - dVar1));
  dVar31 = dVar1 - dVar16;
  local_7f50 = (dVar1 - (dVar31 + (dVar1 - dVar31))) + ((dVar1 - dVar31) - dVar16);
  dVar15 = dVar41 + dVar31;
  local_7f48 = (dVar41 - (dVar15 - (dVar15 - dVar41))) + (dVar31 - (dVar15 - dVar41));
  dVar1 = b_03 * b_01;
  dVar16 = dVar25 * dVar10 - (((dVar1 - dVar20 * dVar46) - dVar46 * dVar10) - dVar20 * dVar25);
  dVar10 = b_06 * b_02;
  dVar31 = dVar43 * dVar19 - (((dVar10 - dVar29 * dVar14) - dVar14 * dVar43) - dVar29 * dVar19);
  dVar41 = dVar16 - dVar31;
  local_7e58 = (dVar16 - (dVar41 + (dVar16 - dVar41))) + ((dVar16 - dVar41) - dVar31);
  dVar31 = dVar1 + dVar41;
  dVar1 = (dVar1 - (dVar31 - (dVar31 - dVar1))) + (dVar41 - (dVar31 - dVar1));
  dVar41 = dVar1 - dVar10;
  local_7e50 = (dVar1 - (dVar41 + (dVar1 - dVar41))) + ((dVar1 - dVar41) - dVar10);
  dVar14 = dVar31 + dVar41;
  local_7e48 = (dVar31 - (dVar14 - (dVar14 - dVar31))) + (dVar41 - (dVar14 - dVar31));
  dVar1 = dVar33 - dVar27;
  dVar31 = dVar22 - dVar27;
  dVar10 = dVar24 - dVar27;
  dVar41 = dVar37 - dVar27;
  local_7f60 = dVar42;
  local_7f40 = dVar15;
  local_7f20 = dVar32;
  local_7e40 = dVar14;
  local_7e20 = dVar38;
  local_7e00 = dVar34;
  iVar2 = scale_expansion_zeroelim(4,&local_7e38,dVar31,local_7e98);
  local_8078 = -dVar10;
  iVar3 = scale_expansion_zeroelim(4,&local_7e58,-dVar10,local_7ed8);
  iVar4 = scale_expansion_zeroelim(4,&local_7e18,dVar41,local_7f18);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_7e98,iVar3,local_7ed8,local_7df8);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,local_7f18,iVar2,local_7df8,local_7d78);
  iVar3 = scale_expansion_zeroelim(iVar2,local_7d78,b_05,local_79b8);
  iVar3 = scale_expansion_zeroelim(iVar3,local_79b8,-b_05,local_7cb8);
  iVar4 = scale_expansion_zeroelim(iVar2,local_7d78,b_04,local_79b8);
  iVar4 = scale_expansion_zeroelim(iVar4,local_79b8,-b_04,local_7538);
  iVar2 = scale_expansion_zeroelim(iVar2,local_7d78,dVar1,local_79b8);
  iVar2 = scale_expansion_zeroelim(iVar2,local_79b8,-dVar1,local_7838);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_7cb8,iVar4,local_7538,local_7238);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,local_7238,iVar2,local_7838,local_5a38);
  iVar3 = scale_expansion_zeroelim(4,&local_7f78,dVar10,local_7e98);
  iVar4 = scale_expansion_zeroelim(4,&local_7f58,dVar41,local_7ed8);
  iVar5 = scale_expansion_zeroelim(4,&local_7e38,dVar1,local_7f18);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_7e98,iVar4,local_7ed8,local_7df8);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,local_7f18,iVar3,local_7df8,local_7d78);
  iVar4 = scale_expansion_zeroelim(iVar3,local_7d78,b_03,local_79b8);
  iVar4 = scale_expansion_zeroelim(iVar4,local_79b8,b_03,local_7cb8);
  iVar5 = scale_expansion_zeroelim(iVar3,local_7d78,b_02,local_79b8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_79b8,b_02,local_7538);
  iVar3 = scale_expansion_zeroelim(iVar3,local_7d78,dVar31,local_79b8);
  iVar3 = scale_expansion_zeroelim(iVar3,local_79b8,dVar31,local_7838);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_7cb8,iVar5,local_7538,local_7238);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,local_7238,iVar3,local_7838,local_6338);
  iVar4 = scale_expansion_zeroelim(4,&local_7f38,dVar41,local_7e98);
  iVar5 = scale_expansion_zeroelim(4,&local_7e58,dVar1,local_7ed8);
  iVar6 = scale_expansion_zeroelim(4,&local_7f78,dVar31,local_7f18);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_7e98,iVar5,local_7ed8,local_7df8);
  iVar4 = fast_expansion_sum_zeroelim(iVar6,local_7f18,iVar4,local_7df8,local_7d78);
  iVar5 = scale_expansion_zeroelim(iVar4,local_7d78,b_00,local_79b8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_79b8,-b_00,local_7cb8);
  iVar6 = scale_expansion_zeroelim(iVar4,local_7d78,b,local_79b8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_79b8,-b,local_7538);
  iVar4 = scale_expansion_zeroelim(iVar4,local_7d78,dVar10,local_79b8);
  iVar4 = scale_expansion_zeroelim(iVar4,local_79b8,local_8078,local_7838);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_7cb8,iVar6,local_7538,local_7238);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,local_7238,iVar4,local_7838,local_6c38);
  iVar5 = scale_expansion_zeroelim(4,&local_7e18,dVar1,local_7e98);
  local_8068 = -dVar31;
  iVar6 = scale_expansion_zeroelim(4,&local_7f58,-dVar31,local_7ed8);
  iVar7 = scale_expansion_zeroelim(4,&local_7f38,dVar10,local_7f18);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_7e98,iVar6,local_7ed8,local_7df8);
  iVar5 = fast_expansion_sum_zeroelim(iVar7,local_7f18,iVar5,local_7df8,local_7d78);
  iVar6 = scale_expansion_zeroelim(iVar5,local_7d78,b_06,local_79b8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_79b8,b_06,local_7cb8);
  iVar7 = scale_expansion_zeroelim(iVar5,local_7d78,b_01,local_79b8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_79b8,b_01,local_7538);
  iVar5 = scale_expansion_zeroelim(iVar5,local_7d78,dVar41,local_79b8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_79b8,dVar41,local_7838);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_7cb8,iVar7,local_7538,local_7238);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_7238,iVar5,local_7838,local_5138);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_5a38,iVar3,local_6338,local_1238);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,local_6c38,iVar5,local_5138,local_2438);
  uVar8 = fast_expansion_sum_zeroelim(iVar2,local_1238,iVar3,local_2438,local_4838);
  if (1 < (int)uVar8) {
    uVar9 = 1;
    do {
      local_4838[0] = local_4838[0] + local_4838[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if ((local_4838[0] < isperrboundB * permanent) && (-local_4838[0] < isperrboundB * permanent)) {
    dVar16 = (dVar12 - (b_05 + (dVar12 - b_05))) + ((dVar12 - b_05) - dVar17);
    dVar12 = (dVar26 - (b_04 + (dVar26 - b_04))) + ((dVar26 - b_04) - dVar30);
    dVar18 = (dVar33 - (dVar1 + (dVar33 - dVar1))) + ((dVar33 - dVar1) - dVar27);
    dVar26 = (dVar23 - (b_03 + (dVar23 - b_03))) + ((dVar23 - b_03) - dVar17);
    dVar19 = (dVar21 - (b_02 + (dVar21 - b_02))) + ((dVar21 - b_02) - dVar30);
    dVar33 = (dVar22 - (dVar31 + (dVar22 - dVar31))) + ((dVar22 - dVar31) - dVar27);
    dVar23 = (dVar45 - (b_00 + (dVar45 - b_00))) + ((dVar45 - b_00) - dVar17);
    dVar21 = (dVar39 - (b + (dVar39 - b))) + ((dVar39 - b) - dVar30);
    dVar39 = (dVar24 - (dVar10 + (dVar24 - dVar10))) + ((dVar24 - dVar10) - dVar27);
    dVar45 = (dVar13 - (b_06 + (dVar13 - b_06))) + ((dVar13 - b_06) - dVar17);
    dVar30 = (dVar11 - (b_01 + (dVar11 - b_01))) + ((dVar11 - b_01) - dVar30);
    dVar17 = (dVar37 - (dVar41 + (dVar37 - dVar41))) + ((dVar37 - dVar41) - dVar27);
    if (((((dVar16 != 0.0) || (((NAN(dVar16) || (dVar12 != 0.0)) || (NAN(dVar12))))) ||
         (((dVar18 != 0.0 || (NAN(dVar18))) || (dVar26 != 0.0)))) ||
        (((NAN(dVar26) || (dVar19 != 0.0)) ||
         ((NAN(dVar19) ||
          ((((dVar33 != 0.0 || (NAN(dVar33))) || (dVar23 != 0.0)) ||
           ((NAN(dVar23) || (dVar21 != 0.0)))))))))) ||
       (((NAN(dVar21) || ((dVar39 != 0.0 || (NAN(dVar39))))) ||
        (((dVar45 != 0.0 || (((NAN(dVar45) || (dVar30 != 0.0)) || (NAN(dVar30))))) ||
         ((dVar17 != 0.0 || (NAN(dVar17))))))))) {
      dVar37 = permanent * isperrboundC + ABS(local_4838[0]) * resulterrbound;
      dVar20 = (b_05 * dVar19 + dVar16 * b_02) - (b_04 * dVar26 + b_03 * dVar12);
      dVar27 = (b_03 * dVar21 + dVar26 * b) - (b_02 * dVar23 + b_00 * dVar19);
      dVar22 = (b_00 * dVar30 + dVar23 * b_01) - (b * dVar45 + b_06 * dVar21);
      dVar13 = (b_06 * dVar12 + b_04 * dVar45) - (b_01 * dVar16 + b_05 * dVar30);
      dVar11 = (b_05 * dVar21 + dVar16 * b) - (b_04 * dVar23 + b_00 * dVar12);
      dVar24 = (b_03 * dVar30 + dVar26 * b_01) - (b_02 * dVar45 + b_06 * dVar19);
      dVar12 = ((dVar10 * dVar32 + dVar1 * dVar34 + dVar15 * local_8068) *
                (dVar17 * dVar41 + b_06 * dVar45 + b_01 * dVar30) +
               (dVar1 * dVar38 + dVar10 * dVar42 + dVar41 * dVar15) *
               (b_03 * dVar26 + b_02 * dVar19 + dVar31 * dVar33)) -
               ((dVar31 * dVar42 + dVar41 * dVar32 + dVar1 * dVar14) *
                (dVar10 * dVar39 + b_00 * dVar23 + b * dVar21) +
               (dVar34 * dVar41 + dVar38 * dVar31 + local_8078 * dVar14) *
               (dVar18 * dVar1 + b_05 * dVar16 + b_04 * dVar12));
      local_4838[0] =
           dVar12 + dVar12 +
           (((dVar39 * dVar32 + (dVar18 * dVar34 - dVar15 * dVar33) +
             dVar10 * dVar20 + dVar1 * dVar27 + dVar11 * local_8068) *
             (dVar41 * dVar41 + b_06 * b_06 + b_01 * b_01) +
            (dVar18 * dVar38 + dVar39 * dVar42 + dVar17 * dVar15 +
            dVar1 * dVar22 + dVar10 * dVar13 + dVar41 * dVar11) *
            (dVar31 * dVar31 + b_03 * b_03 + b_02 * b_02)) -
           ((dVar33 * dVar42 + dVar17 * dVar32 + dVar18 * dVar14 +
            dVar13 * dVar31 + dVar20 * dVar41 + dVar24 * dVar1) *
            (dVar10 * dVar10 + b_00 * b_00 + b * b) +
           (dVar17 * dVar34 + (dVar33 * dVar38 - dVar14 * dVar39) +
           dVar27 * dVar41 + dVar22 * dVar31 + dVar24 * local_8078) *
           (dVar1 * dVar1 + b_05 * b_05 + b_04 * b_04))) + local_4838[0];
      if ((local_4838[0] < dVar37) && (-local_4838[0] < dVar37)) {
        dVar12 = insphereexact(pa,pb,pc,pd,pe);
        return dVar12;
      }
    }
  }
  return local_4838[0];
}

Assistant:

REAL insphereadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe,
                   REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24], temp48[48];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len, temp48len;
  REAL xdet[96], ydet[96], zdet[96], xydet[192];
  int xlen, ylen, zlen, xylen;
  REAL adet[288], bdet[288], cdet[288], ddet[288];
  int alen, blen, clen, dlen;
  REAL abdet[576], cddet[576];
  int ablen, cdlen;
  REAL fin1[1152];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -aex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -aey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -aez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  alen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, bex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, bey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, bez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  blen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -cex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -cey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -cez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  clen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, dex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, dey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, dez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  dlen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += (((bex * bex + bey * bey + bez * bez)
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + (dex * dex + dey * dey + dez * dez)
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - ((aex * aex + aey * aey + aez * aez)
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + (cex * cex + cey * cey + cez * cez)
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + 2.0 * (((bex * bextail + bey * beytail + bez * beztail)
                 * (cez * da3 + dez * ac3 + aez * cd3)
                 + (dex * dextail + dey * deytail + dez * deztail)
                 * (aez * bc3 - bez * ac3 + cez * ab3))
                - ((aex * aextail + aey * aeytail + aez * aeztail)
                 * (bez * cd3 - cez * bd3 + dez * bc3)
                 + (cex * cextail + cey * ceytail + cez * ceztail)
                 * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return insphereexact(pa, pb, pc, pd, pe);
}